

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckColorAvailable(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
    if (TVar1 == TidyTag_SCRIPT) {
      prvTidyReportAccessWarning(doc,node,0x145);
      return;
    }
    if (TVar1 == TidyTag_IMG) {
      prvTidyReportAccessWarning(doc,node,0x142);
      return;
    }
    if (TVar1 == TidyTag_INPUT) {
      prvTidyReportAccessWarning(doc,node,0x146);
      return;
    }
    if (TVar1 == TidyTag_OBJECT) {
      prvTidyReportAccessWarning(doc,node,0x144);
      return;
    }
    if (TVar1 == TidyTag_APPLET) {
      prvTidyReportAccessWarning(doc,node,0x143);
      return;
    }
  }
  return;
}

Assistant:

static void CheckColorAvailable( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        if ( nodeIsIMG(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_IMAGE );

        else if ( nodeIsAPPLET(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_APPLET );

        else if ( nodeIsOBJECT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_OBJECT );

        else if ( nodeIsSCRIPT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_SCRIPT );

        else if ( nodeIsINPUT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_INPUT );
    }
}